

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O2

void __thiscall
vkt::ubo::anon_unknown_0::BlockSingleStructCase::BlockSingleStructCase
          (BlockSingleStructCase *this,TestContext *testCtx,string *name,string *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  ShaderInterface *this_00;
  StructType *this_01;
  UniformBlock *pUVar1;
  allocator<char> local_99;
  string local_98;
  Uniform local_78;
  VarType local_38;
  
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,matrixLoadFlag,false)
  ;
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_00bd5210;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"S",(allocator<char> *)&local_98);
  this_00 = &(this->super_UniformBlockCase).m_interface;
  this_01 = ShaderInterface::allocStruct(this_00,&local_78.m_name);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"a",(allocator<char> *)&local_38);
  VarType::VarType((VarType *)&local_98,TYPE_INT_VEC3,4);
  StructType::addMember(this_01,&local_78.m_name,(VarType *)&local_98,0x1800);
  VarType::~VarType((VarType *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"b",&local_99);
  VarType::VarType(&local_38,TYPE_FLOAT_MAT3,2);
  VarType::VarType((VarType *)&local_98,&local_38,4);
  StructType::addMember(this_01,&local_78.m_name,(VarType *)&local_98,0);
  VarType::~VarType((VarType *)&local_98);
  VarType::~VarType(&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"c",(allocator<char> *)&local_38);
  VarType::VarType((VarType *)&local_98,TYPE_FLOAT_VEC4,4);
  StructType::addMember(this_01,&local_78.m_name,(VarType *)&local_98,0);
  VarType::~VarType((VarType *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Block",(allocator<char> *)&local_98);
  pUVar1 = ShaderInterface::allocBlock(this_00,&local_78.m_name);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"s",&local_99);
  VarType::VarType(&local_38,this_01,0);
  Uniform::Uniform(&local_78,&local_98,&local_38,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back
            (&pUVar1->m_uniforms,&local_78);
  Uniform::~Uniform(&local_78);
  VarType::~VarType(&local_38);
  std::__cxx11::string::~string((string *)&local_98);
  pUVar1->m_flags = layoutFlags;
  if (0 < numInstances) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"block",(allocator<char> *)&local_98);
    std::__cxx11::string::_M_assign((string *)&pUVar1->m_instanceName);
    std::__cxx11::string::~string((string *)&local_78);
    pUVar1->m_arraySize = numInstances;
  }
  (*(this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

BlockSingleStructCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: UniformBlockCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH), UNUSED_BOTH); // First member is unused.
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(numInstances);
		}

		init();
	}